

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-try-send.c
# Opt level: O1

void sv_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *rcvbuf,sockaddr *addr,uint flags)

{
  bool bVar1;
  int iVar2;
  ssize_t *psVar3;
  ssize_t **ppsVar4;
  int64_t eval_b;
  int64_t eval_a;
  ssize_t local_10;
  ssize_t *local_8;
  
  iVar2 = recv_cnt + 1;
  bVar1 = recv_cnt < 4;
  psVar3 = (ssize_t *)nread;
  recv_cnt = iVar2;
  if (bVar1) {
    local_8 = (ssize_t *)0xa;
    if (nread == 10) {
      return;
    }
    psVar3 = &local_10;
    local_10 = nread;
    sv_recv_cb_cold_2();
  }
  local_10 = 0;
  if (psVar3 == (ssize_t *)0x0) {
    return;
  }
  ppsVar4 = &local_8;
  local_8 = psVar3;
  sv_recv_cb_cold_1();
  iVar2 = uv_is_closing();
  if (iVar2 == 0) {
    uv_close(ppsVar4,0);
    return;
  }
  return;
}

Assistant:

static void sv_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* rcvbuf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  ASSERT_GT(nread, 0);

  if (nread == 0) {
    ASSERT_NULL(addr);
    return;
  }

  ASSERT_EQ(4, nread);
  ASSERT_NOT_NULL(addr);

  ASSERT_OK(memcmp("EXIT", rcvbuf->base, nread));
  uv_close((uv_handle_t*) handle, close_cb);
  uv_close((uv_handle_t*) &client, close_cb);

  sv_recv_cb_called++;
}